

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parameters.cc
# Opt level: O0

void __thiscall xLearn::Model::Model(Model *this,string *filename)

{
  byte bVar1;
  bool bVar2;
  ostream *poVar3;
  ostream *poVar4;
  undefined8 uVar5;
  string *in_RDI;
  string *function;
  string *in_stack_fffffffffffffee0;
  int line;
  string *in_stack_ffffffffffffff68;
  LogSeverity in_stack_ffffffffffffff74;
  allocator local_71;
  string local_70 [39];
  allocator local_49;
  string local_48 [8];
  string *in_stack_ffffffffffffffc0;
  Model *in_stack_ffffffffffffffc8;
  Logger local_14 [5];
  
  std::__cxx11::string::string(in_RDI);
  function = (string *)(in_RDI + 0x20);
  std::__cxx11::string::string((string *)function);
  *(undefined8 *)(in_RDI + 0x58) = 0;
  *(undefined8 *)(in_RDI + 0x60) = 0;
  *(undefined8 *)(in_RDI + 0x68) = 0;
  *(undefined8 *)(in_RDI + 0x70) = 0;
  *(undefined8 *)(in_RDI + 0x78) = 0;
  *(undefined8 *)(in_RDI + 0x80) = 0;
  bVar1 = std::__cxx11::string::empty();
  line = (int)((ulong)in_RDI >> 0x20);
  if ((bVar1 & 1) == 1) {
    Logger::Logger(local_14,ERR);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_48,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
               ,&local_49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"Model",&local_71);
    poVar3 = Logger::Start(in_stack_ffffffffffffff74,in_stack_ffffffffffffff68,line,function);
    poVar3 = std::operator<<(poVar3,"CHECK_NE failed ");
    poVar3 = std::operator<<(poVar3,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/data/model_parameters.cc"
                            );
    poVar3 = std::operator<<(poVar3,":");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,0xca);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"filename.empty()");
    poVar3 = std::operator<<(poVar3," = ");
    bVar2 = (bool)std::__cxx11::string::empty();
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,bVar2);
    poVar3 = std::operator<<(poVar3,"\n");
    poVar3 = std::operator<<(poVar3,"true");
    poVar4 = std::operator<<(poVar3," = ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,true);
    std::operator<<(poVar4,"\n");
    std::__cxx11::string::~string(local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    Logger::~Logger((Logger *)poVar3);
    abort();
  }
  bVar2 = Deserialize(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (!bVar2) {
    uVar5 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_(&stack0xffffffffffffff68,"Cannot Load model from the file: %s",uVar5);
    Color::print_error(in_stack_fffffffffffffee0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff68);
    exit(0);
  }
  return;
}

Assistant:

Model::Model(const std::string& filename) {
  CHECK_NE(filename.empty(), true);
  if (this->Deserialize(filename) == false) {
    Color::print_error(
      StringPrintf("Cannot Load model from the file: %s",
           filename.c_str())
    );
    exit(0);
  }
}